

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O0

int zstd_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  uint32_t uVar1;
  uint zstd_magic;
  uint prefix;
  ssize_t avail;
  uchar *buffer;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  buffer = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  avail = (ssize_t)__archive_read_filter_ahead(filter,4,(ssize_t *)&zstd_magic);
  if ((void *)avail == (void *)0x0) {
    self_local._4_4_ = 0;
  }
  else {
    uVar1 = archive_le32dec((void *)avail);
    if (uVar1 == 0xfd2fb528) {
      self_local._4_4_ = 0x20;
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
zstd_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	unsigned prefix;

	/* Zstd frame magic values */
	const unsigned zstd_magic = 0xFD2FB528U;

	(void) self; /* UNUSED */

	buffer = __archive_read_filter_ahead(filter, 4, &avail);
	if (buffer == NULL)
		return (0);

	prefix = archive_le32dec(buffer);
	if (prefix == zstd_magic)
		return (32);

	return (0);
}